

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void set_hflags_for_handler(CPUMIPSState_conflict5 *env)

{
  uint uVar1;
  
  uVar1 = env->hflags & 0xfffffbff;
  env->hflags = uVar1;
  if ((env->insn_flags & 0x10000000000) != 0) {
    env->hflags = (uint)env->CP0_Config3 >> 6 & 0x400 | uVar1;
  }
  return;
}

Assistant:

static void set_hflags_for_handler(CPUMIPSState *env)
{
    /* Exception handlers are entered in 32-bit mode.  */
    env->hflags &= ~(MIPS_HFLAG_M16);
    /* ...except that microMIPS lets you choose.  */
    if (env->insn_flags & ASE_MICROMIPS) {
        env->hflags |= (!!(env->CP0_Config3 &
                           (1 << CP0C3_ISA_ON_EXC))
                        << MIPS_HFLAG_M16_SHIFT);
    }
}